

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O2

unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> __thiscall
spvtools::opt::InstDebugPrintfPass::NewGlobalName
          (InstDebugPrintfPass *this,uint32_t id,string *name_str)

{
  string prefixed_name;
  allocator<char> local_49;
  string local_48 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_48,"inst_printf_",&local_49);
  std::__cxx11::string::append(local_48);
  InstrumentPass::NewName(&this->super_InstrumentPass,id,(string *)((ulong)name_str & 0xffffffff));
  std::__cxx11::string::_M_dispose();
  return (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Instruction> InstDebugPrintfPass::NewGlobalName(
    uint32_t id, const std::string& name_str) {
  std::string prefixed_name{"inst_printf_"};
  prefixed_name += name_str;
  return NewName(id, prefixed_name);
}